

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit_reporter.h
# Opt level: O2

void __thiscall bandit::detail::xunit_reporter::it_skip(xunit_reporter *this,char *desc)

{
  int *piVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  allocator local_69;
  string local_68;
  string local_48;
  
  piVar1 = &(this->super_progress_reporter).specs_skipped_;
  *piVar1 = *piVar1 + 1;
  puVar2 = &this->field_0x80;
  poVar3 = std::operator<<((ostream *)puVar2,"\t<testcase classname=\"");
  progress_reporter::current_context_name_abi_cxx11_(&local_48,&this->super_progress_reporter);
  escape(&local_68,this,&local_48);
  poVar3 = std::operator<<(poVar3,(string *)&local_68);
  std::operator<<(poVar3,"\" ");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar3 = std::operator<<((ostream *)puVar2,"name=\"");
  std::__cxx11::string::string((string *)&local_48,desc,&local_69);
  escape(&local_68,this,&local_48);
  poVar3 = std::operator<<(poVar3,(string *)&local_68);
  std::operator<<(poVar3,"\" time=\"0\">\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)puVar2,"\t\t<skipped />\n");
  std::operator<<((ostream *)puVar2,"\t</testcase>\n");
  return;
}

Assistant:

void it_skip(const char* desc)
    {
      progress_reporter::it_skip(desc);
      work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
      work_stm_ << "name=\"" << escape(desc) << "\" time=\"0\">\n";
      work_stm_ << "\t\t<skipped />\n";
      work_stm_ << "\t</testcase>\n";
    }